

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)110,(moira::Mode)6,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Ea<(moira::Mode)6,_(moira::Size)2> src;
  Ea<(moira::Mode)6,_(moira::Size)2> local_24;
  
  Op<(moira::Mode)6,(moira::Size)2>(&local_24,this,op & 7,addr);
  pcVar4 = "smi";
  if (str->upper != false) {
    pcVar4 = "SMI";
  }
  cVar1 = *pcVar4;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar1;
    cVar1 = *pcVar4;
  }
  iVar2 = (this->tab).raw;
  while (pcVar4 = str->ptr, pcVar4 < str->base + iVar2) {
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,&local_24);
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src;
}